

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O2

int run_test_fs_copyfile(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  char src [14];
  uv_fs_t req;
  
  builtin_strncpy(src + 8,"e_src",6);
  builtin_strncpy(src,"test_fil",8);
  loop = uv_default_loop();
  iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",-1,(uv_fs_cb)0x0);
  eval_a = (int64_t)iVar1;
  eval_b = -0x16;
  if (eval_a == -0x16) {
    uv_fs_req_cleanup(&req);
    unlink(src);
    unlink("test_file_dst");
    iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,(uv_fs_cb)0x0);
    eval_a = req.result;
    eval_b = -2;
    if (req.result == -2) {
      eval_a = (int64_t)iVar1;
      eval_b = -2;
      if (eval_a == -2) {
        uv_fs_req_cleanup(&req);
        iVar1 = uv_fs_stat((uv_loop_t *)0x0,&req,"test_file_dst",(uv_fs_cb)0x0);
        if (iVar1 == 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
                  ,0x7b,"r");
          abort();
        }
        uv_fs_req_cleanup(&req);
        touch_file(src,0xc);
        iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,src,0,(uv_fs_cb)0x0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          uv_fs_req_cleanup(&req);
          iVar1 = uv_fs_stat((uv_loop_t *)0x0,&req,src,(uv_fs_cb)0x0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            eval_a = 0xc;
            eval_b = req.statbuf.st_size;
            if (req.statbuf.st_size == 0xc) {
              uv_fs_req_cleanup(&req);
              unlink(src);
              unlink("test_file_dst");
              iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,"test/fixtures/load_error.node",
                                     "test_file_dst",0,(uv_fs_cb)0x0);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                handle_result(&req);
                unlink("test_file_dst");
                touch_file(src,0);
                iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,(uv_fs_cb)0x0);
                eval_a = (int64_t)iVar1;
                eval_b = 0;
                if (eval_a == 0) {
                  handle_result(&req);
                  iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,"test/fixtures/load_error.node",
                                         "test_file_dst",0,(uv_fs_cb)0x0);
                  eval_a = (int64_t)iVar1;
                  eval_b = 0;
                  if (eval_a == 0) {
                    handle_result(&req);
                    iVar1 = uv_fs_chmod((uv_loop_t *)0x0,&req,"test_file_dst",0x1a4,(uv_fs_cb)0x0);
                    eval_a = (int64_t)iVar1;
                    eval_b = 0;
                    if (eval_a == 0) {
                      uv_fs_req_cleanup(&req);
                      iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,"test/fixtures/load_error.node",
                                             "test_file_dst",1,(uv_fs_cb)0x0);
                      eval_a = (int64_t)iVar1;
                      eval_b = -0x11;
                      if (eval_a == -0x11) {
                        uv_fs_req_cleanup(&req);
                        iVar1 = uv_fs_chmod((uv_loop_t *)0x0,&req,"test_file_dst",0x1a4,
                                            (uv_fs_cb)0x0);
                        eval_a = (int64_t)iVar1;
                        eval_b = 0;
                        if (eval_a == 0) {
                          uv_fs_req_cleanup(&req);
                          touch_file(src,1);
                          iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,
                                                 (uv_fs_cb)0x0);
                          eval_a = (int64_t)iVar1;
                          eval_b = 0;
                          if (eval_a == 0) {
                            handle_result(&req);
                            unlink("test_file_dst");
                            touch_file(src,0x2000);
                            iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,
                                                   (uv_fs_cb)0x0);
                            eval_a = (int64_t)iVar1;
                            eval_b = 0;
                            if (eval_a == 0) {
                              handle_result(&req);
                              unlink(src);
                              unlink("test_file_dst");
                              iVar1 = uv_fs_copyfile(loop,&req,"test/fixtures/load_error.node",
                                                     "test_file_dst",0,handle_result);
                              eval_a = (int64_t)iVar1;
                              eval_b = 0;
                              if (eval_a == 0) {
                                eval_a = 5;
                                eval_b = (int64_t)result_check_count;
                                if (eval_b == 5) {
                                  uv_run(loop,UV_RUN_DEFAULT);
                                  eval_a = 6;
                                  eval_b = (int64_t)result_check_count;
                                  if (eval_b == 6) {
                                    iVar1 = uv_fs_chmod((uv_loop_t *)0x0,&req,"test_file_dst",0x1a4,
                                                        (uv_fs_cb)0x0);
                                    eval_a = (int64_t)iVar1;
                                    eval_b = 0;
                                    if (eval_a == 0) {
                                      uv_fs_req_cleanup(&req);
                                      unlink("test_file_dst");
                                      iVar1 = uv_fs_copyfile(loop,&req,
                                                             "test/fixtures/load_error.node",
                                                             "test_file_dst",-1,fail_cb);
                                      eval_a = (int64_t)iVar1;
                                      eval_b = -0x16;
                                      if (eval_a == -0x16) {
                                        uv_run(loop,UV_RUN_DEFAULT);
                                        unlink("test_file_dst");
                                        iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,
                                                               "test/fixtures/load_error.node",
                                                               "test_file_dst",2,(uv_fs_cb)0x0);
                                        eval_a = (int64_t)iVar1;
                                        eval_b = 0;
                                        if (eval_a == 0) {
                                          handle_result(&req);
                                          unlink("test_file_dst");
                                          iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,
                                                                 "test/fixtures/load_error.node",
                                                                 "test_file_dst",4,(uv_fs_cb)0x0);
                                          eval_a = (int64_t)iVar1;
                                          eval_b = 0;
                                          if (eval_a < 1) {
                                            if (iVar1 == 0) {
                                              handle_result(&req);
                                            }
                                            unlink("test_file_dst");
                                            touch_file("test_file_dst",0);
                                            chmod("test_file_dst",0x124);
                                            iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,
                                                                   "test/fixtures/load_error.node",
                                                                   "test_file_dst",0,(uv_fs_cb)0x0);
                                            eval_a = req.result;
                                            eval_b = -0xd;
                                            if (req.result == -0xd) {
                                              eval_a = (int64_t)iVar1;
                                              eval_b = -0xd;
                                              if (eval_a == -0xd) {
                                                uv_fs_req_cleanup(&req);
                                                unlink("test_file_dst");
                                                uv_walk(loop,close_walk_cb,(void *)0x0);
                                                uv_run(loop,UV_RUN_DEFAULT);
                                                eval_a = 0;
                                                iVar1 = uv_loop_close(loop);
                                                eval_b = (int64_t)iVar1;
                                                if (eval_b == 0) {
                                                  uv_library_shutdown();
                                                  return 0;
                                                }
                                                pcVar4 = "==";
                                                pcVar5 = "uv_loop_close(loop)";
                                                pcVar3 = "0";
                                                uVar2 = 0xe2;
                                              }
                                              else {
                                                pcVar4 = "==";
                                                pcVar5 = "UV_EACCES";
                                                pcVar3 = "r";
                                                uVar2 = 0xdc;
                                              }
                                            }
                                            else {
                                              pcVar4 = "==";
                                              pcVar5 = "UV_EACCES";
                                              pcVar3 = "req.result";
                                              uVar2 = 0xdb;
                                            }
                                          }
                                          else {
                                            pcVar4 = "<=";
                                            pcVar5 = "0";
                                            pcVar3 = "r";
                                            uVar2 = 0xce;
                                          }
                                        }
                                        else {
                                          pcVar4 = "==";
                                          pcVar5 = "0";
                                          pcVar3 = "r";
                                          uVar2 = 199;
                                        }
                                      }
                                      else {
                                        pcVar4 = "==";
                                        pcVar5 = "UV_EINVAL";
                                        pcVar3 = "r";
                                        uVar2 = 0xc1;
                                      }
                                    }
                                    else {
                                      pcVar4 = "==";
                                      pcVar5 = "0";
                                      pcVar3 = 
                                      "uv_fs_chmod(((void*)0), &req, dst, 0644, ((void*)0))";
                                      uVar2 = 0xbb;
                                    }
                                  }
                                  else {
                                    pcVar4 = "==";
                                    pcVar5 = "result_check_count";
                                    pcVar3 = "6";
                                    uVar2 = 0xb9;
                                  }
                                }
                                else {
                                  pcVar4 = "==";
                                  pcVar5 = "result_check_count";
                                  pcVar3 = "5";
                                  uVar2 = 0xb7;
                                }
                              }
                              else {
                                pcVar4 = "==";
                                pcVar5 = "0";
                                pcVar3 = "r";
                                uVar2 = 0xb6;
                              }
                            }
                            else {
                              pcVar4 = "==";
                              pcVar5 = "0";
                              pcVar3 = "r";
                              uVar2 = 0xaf;
                            }
                          }
                          else {
                            pcVar4 = "==";
                            pcVar5 = "0";
                            pcVar3 = "r";
                            uVar2 = 0xa8;
                          }
                        }
                        else {
                          pcVar4 = "==";
                          pcVar5 = "0";
                          pcVar3 = "uv_fs_chmod(((void*)0), &req, dst, 0644, ((void*)0))";
                          uVar2 = 0xa4;
                        }
                      }
                      else {
                        pcVar4 = "==";
                        pcVar5 = "UV_EEXIST";
                        pcVar3 = "r";
                        uVar2 = 0xa0;
                      }
                    }
                    else {
                      pcVar4 = "==";
                      pcVar5 = "0";
                      pcVar3 = "uv_fs_chmod(((void*)0), &req, dst, 0644, ((void*)0))";
                      uVar2 = 0x9d;
                    }
                  }
                  else {
                    pcVar4 = "==";
                    pcVar5 = "0";
                    pcVar3 = "r";
                    uVar2 = 0x99;
                  }
                }
                else {
                  pcVar4 = "==";
                  pcVar5 = "0";
                  pcVar3 = "r";
                  uVar2 = 0x94;
                }
              }
              else {
                pcVar4 = "==";
                pcVar5 = "0";
                pcVar3 = "r";
                uVar2 = 0x8d;
              }
            }
            else {
              pcVar4 = "==";
              pcVar5 = "req.statbuf.st_size";
              pcVar3 = "12";
              uVar2 = 0x86;
            }
          }
          else {
            pcVar4 = "==";
            pcVar5 = "0";
            pcVar3 = "r";
            uVar2 = 0x85;
          }
        }
        else {
          pcVar4 = "==";
          pcVar5 = "0";
          pcVar3 = "r";
          uVar2 = 0x81;
        }
        goto LAB_0011af68;
      }
      pcVar5 = "UV_ENOENT";
      pcVar3 = "r";
      uVar2 = 0x77;
    }
    else {
      pcVar5 = "UV_ENOENT";
      pcVar3 = "req.result";
      uVar2 = 0x76;
    }
  }
  else {
    pcVar5 = "UV_EINVAL";
    pcVar3 = "r";
    uVar2 = 0x6f;
  }
  pcVar4 = "==";
LAB_0011af68:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
          ,uVar2,pcVar3,pcVar4,pcVar5,eval_a,pcVar4,eval_b);
  abort();
}

Assistant:

TEST_IMPL(fs_copyfile) {
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_EQ(req.result, UV_ENOENT);
  ASSERT_EQ(r, UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
  /* Verify that the src file did not get truncated. */
  r = uv_fs_stat(NULL, &req, src, NULL);
  ASSERT_OK(r);
  ASSERT_EQ(12, req.statbuf.st_size);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT_EQ(r, UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT_OK(r);
  ASSERT_EQ(5, result_check_count);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(6, result_check_count);
  /* Ensure file is user-writable (not copied from src). */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT_EQ(r, UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT_LE(r, 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT_EQ(req.result, UV_EACCES);
  ASSERT_EQ(r, UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}